

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Fl_Preferences *parent,int groupIndex)

{
  int iVar1;
  char *path;
  Node *pNVar2;
  int groupIndex_local;
  Fl_Preferences *parent_local;
  Fl_Preferences *this_local;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Preferences_002ecfc8;
  this->rootNode = parent->rootNode;
  if ((-1 < groupIndex) && (iVar1 = groups(parent), groupIndex < iVar1)) {
    pNVar2 = Node::childNode(parent->node,groupIndex);
    this->node = pNVar2;
    return;
  }
  pNVar2 = parent->node;
  path = newUUID();
  pNVar2 = Node::addChild(pNVar2,path);
  this->node = pNVar2;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Fl_Preferences &parent, int groupIndex ) {
  rootNode = parent.rootNode;
  if (groupIndex<0 || groupIndex>=parent.groups()) {
    node = parent.node->addChild( newUUID() );
  } else {
    node = parent.node->childNode( groupIndex );
  }
}